

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::replace(UnicodeString *this,int32_t start,int32_t _length,UChar32 srcChar)

{
  ulong uVar1;
  ulong in_RAX;
  UnicodeString *pUVar2;
  int32_t srcLength;
  UChar buffer [2];
  undefined8 uStack_8;
  
  uStack_8._0_4_ = (undefined4)in_RAX;
  if ((uint)srcChar < 0x10000) {
    uStack_8._6_2_ = (undefined2)(in_RAX >> 0x30);
    uStack_8._0_6_ = CONCAT24((short)srcChar,(undefined4)uStack_8);
    srcLength = 1;
    uVar1 = uStack_8;
  }
  else {
    srcLength = 0;
    uVar1 = in_RAX;
    if ((uint)srcChar < 0x110000) {
      uStack_8._0_6_ = CONCAT24((short)((uint)srcChar >> 10) + -0x2840,(undefined4)uStack_8);
      uStack_8 = CONCAT26((short)srcChar,(undefined6)uStack_8) & 0x3ffffffffffffff |
                 0xdc00000000000000;
      srcLength = 2;
      uVar1 = uStack_8;
    }
  }
  uStack_8 = uVar1;
  pUVar2 = doReplace(this,start,_length,(UChar *)((long)&uStack_8 + 4),0,srcLength);
  return pUVar2;
}

Assistant:

UnicodeString&
UnicodeString::replace(int32_t start,
               int32_t _length,
               UChar32 srcChar) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t count = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, count, U16_MAX_LENGTH, srcChar, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError (srcChar is not a valid code point) then count==0 which means
  // we remove the source segment rather than replacing it with srcChar.
  return doReplace(start, _length, buffer, 0, isError ? 0 : count);
}